

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

int build_regex_nfa(LexState *ls,uint8 **areg,NFAState *pp,NFAState *nn,Action *trailing)

{
  uint uVar1;
  NFAState **ppNVar2;
  uint8 **ls_00;
  int iVar3;
  int iVar4;
  anon_struct_40_4_d8687ec6_for_epsilon *v;
  NFAState *pNVar5;
  ushort **ppuVar6;
  NFAState *pNVar7;
  ulong uVar8;
  bool bVar9;
  bool local_181;
  char local_178 [8];
  uint8 mark [256];
  int local_70;
  int has_trailing;
  int i;
  int reversed;
  NFAState *n;
  NFAState *x;
  NFAState *s;
  NFAState *p;
  uint8 *reg;
  uint8 pc;
  Action *pAStack_38;
  uint8 c;
  Action *trailing_local;
  NFAState *nn_local;
  NFAState *pp_local;
  uint8 **areg_local;
  LexState *ls_local;
  
  mark[0xfc] = '\0';
  mark[0xfd] = '\0';
  mark[0xfe] = '\0';
  mark[0xff] = '\0';
  x = pp;
  s = pp;
  p = (NFAState *)*areg;
  pAStack_38 = trailing;
  trailing_local = (Action *)nn;
  nn_local = pp;
  pp_local = (NFAState *)areg;
  areg_local = (uint8 **)ls;
LAB_00146a19:
  ls_00 = areg_local;
  pNVar5 = (NFAState *)((long)&p->index + 1);
  reg._7_1_ = (byte)p->index;
  if (reg._7_1_ != 0) {
    switch(reg._7_1_) {
    case 0x28:
      p = pNVar5;
      pNVar5 = new_NFAState((LexState *)areg_local);
      iVar3 = build_regex_nfa((LexState *)ls_00,(uint8 **)&p,x,pNVar5,pAStack_38);
      local_181 = iVar3 != 0 || mark._252_4_ != 0;
      mark._252_4_ = ZEXT14(local_181);
      s = x;
      x = pNVar5;
      break;
    case 0x29:
      goto LAB_00147e6b;
    case 0x2a:
      if ((s->epsilon).v == (NFAState **)0x0) {
        (s->epsilon).v = (s->epsilon).e;
        uVar1 = (s->epsilon).n;
        (s->epsilon).n = uVar1 + 1;
        (s->epsilon).e[uVar1] = x;
        p = pNVar5;
      }
      else if ((s->epsilon).v == (s->epsilon).e) {
        if ((s->epsilon).n < 3) {
          uVar1 = (s->epsilon).n;
          (s->epsilon).n = uVar1 + 1;
          (s->epsilon).v[uVar1] = x;
          p = pNVar5;
        }
        else {
LAB_0014725a:
          p = pNVar5;
          vec_add_internal(&s->epsilon,x);
        }
      }
      else {
        if (((s->epsilon).n & 7) == 0) goto LAB_0014725a;
        uVar1 = (s->epsilon).n;
        (s->epsilon).n = uVar1 + 1;
        (s->epsilon).v[uVar1] = x;
        p = pNVar5;
      }
      if ((x->epsilon).v == (NFAState **)0x0) {
        (x->epsilon).v = (x->epsilon).e;
        uVar1 = (x->epsilon).n;
        (x->epsilon).n = uVar1 + 1;
        (x->epsilon).e[uVar1] = s;
        break;
      }
      if ((x->epsilon).v == (x->epsilon).e) {
        if ((x->epsilon).n < 3) {
          uVar1 = (x->epsilon).n;
          (x->epsilon).n = uVar1 + 1;
          (x->epsilon).v[uVar1] = s;
          break;
        }
      }
      else if (((x->epsilon).n & 7) != 0) {
        uVar1 = (x->epsilon).n;
        (x->epsilon).n = uVar1 + 1;
        (x->epsilon).v[uVar1] = s;
        break;
      }
      vec_add_internal(&x->epsilon,s);
      break;
    case 0x2b:
      if ((x->epsilon).v == (NFAState **)0x0) {
        (x->epsilon).v = (x->epsilon).e;
        uVar1 = (x->epsilon).n;
        (x->epsilon).n = uVar1 + 1;
        (x->epsilon).e[uVar1] = s;
        p = pNVar5;
        break;
      }
      if ((x->epsilon).v == (x->epsilon).e) {
        if ((x->epsilon).n < 3) {
          uVar1 = (x->epsilon).n;
          (x->epsilon).n = uVar1 + 1;
          (x->epsilon).v[uVar1] = s;
          p = pNVar5;
          break;
        }
      }
      else if (((x->epsilon).n & 7) != 0) {
        uVar1 = (x->epsilon).n;
        (x->epsilon).n = uVar1 + 1;
        (x->epsilon).v[uVar1] = s;
        p = pNVar5;
        break;
      }
      p = pNVar5;
      vec_add_internal(&x->epsilon,s);
      break;
    case 0x2f:
      if ((x->accepts).v == (Action **)0x0) {
        (x->accepts).v = (x->accepts).e;
        uVar1 = (x->accepts).n;
        (x->accepts).n = uVar1 + 1;
        (x->accepts).e[uVar1] = pAStack_38;
        p = pNVar5;
      }
      else if ((x->accepts).v == (x->accepts).e) {
        if ((x->accepts).n < 3) {
          uVar1 = (x->accepts).n;
          (x->accepts).n = uVar1 + 1;
          (x->accepts).v[uVar1] = pAStack_38;
          p = pNVar5;
        }
        else {
LAB_00147573:
          p = pNVar5;
          vec_add_internal(&x->accepts,pAStack_38);
        }
      }
      else {
        if (((x->accepts).n & 7) == 0) goto LAB_00147573;
        uVar1 = (x->accepts).n;
        (x->accepts).n = uVar1 + 1;
        (x->accepts).v[uVar1] = pAStack_38;
        p = pNVar5;
      }
      mark[0xfc] = '\x01';
      mark[0xfd] = '\0';
      mark[0xfe] = '\0';
      mark[0xff] = '\0';
      break;
    case 0x3f:
      if ((s->epsilon).v == (NFAState **)0x0) {
        (s->epsilon).v = (s->epsilon).e;
        uVar1 = (s->epsilon).n;
        (s->epsilon).n = uVar1 + 1;
        (s->epsilon).e[uVar1] = x;
        p = pNVar5;
        break;
      }
      if ((s->epsilon).v == (s->epsilon).e) {
        if ((s->epsilon).n < 3) {
          uVar1 = (s->epsilon).n;
          (s->epsilon).n = uVar1 + 1;
          (s->epsilon).v[uVar1] = x;
          p = pNVar5;
          break;
        }
      }
      else if (((s->epsilon).n & 7) != 0) {
        uVar1 = (s->epsilon).n;
        (s->epsilon).n = uVar1 + 1;
        (s->epsilon).v[uVar1] = x;
        p = pNVar5;
        break;
      }
      p = pNVar5;
      vec_add_internal(&s->epsilon,x);
      break;
    case 0x5b:
      bVar9 = (char)pNVar5->index == '^';
      if (bVar9) {
        pNVar5 = (NFAState *)((long)&p->index + 2);
      }
      p = pNVar5;
      memset(local_178,0,0x100);
      reg._6_1_ = 0xff;
      while( true ) {
        pNVar5 = (NFAState *)((long)&p->index + 1);
        reg._7_1_ = (byte)p->index;
        if (reg._7_1_ == 0) break;
        if (reg._7_1_ == 0x2d) {
          pNVar7 = (NFAState *)((long)&p->index + 2);
          reg._7_1_ = (byte)pNVar5->index;
          if (reg._7_1_ == 0) goto LAB_00147f81;
          if (reg._7_1_ == 0x5c) {
            reg._7_1_ = (byte)pNVar7->index;
            pNVar7 = (NFAState *)((long)&p->index + 3);
          }
          p = pNVar7;
          pNVar7 = p;
          if (reg._7_1_ == 0) goto LAB_00147f81;
          for (; reg._6_1_ <= reg._7_1_; reg._6_1_ = reg._6_1_ + 1) {
            local_178[reg._6_1_] = '\x01';
          }
        }
        else {
          if (reg._7_1_ == 0x5c) {
            p = (NFAState *)((long)&p->index + 2);
            reg._7_1_ = (byte)pNVar5->index;
          }
          else {
            p = pNVar5;
            if (reg._7_1_ == 0x5d) break;
          }
          reg._6_1_ = reg._7_1_;
          local_178[reg._7_1_] = '\x01';
        }
      }
      p = pNVar5;
      pNVar5 = new_NFAState((LexState *)areg_local);
      for (local_70 = 1; local_70 < 0x100; local_70 = local_70 + 1) {
        if (((!bVar9) && (local_178[local_70] != '\0')) ||
           ((bVar9 && (local_178[local_70] == '\0')))) {
          if (x->chars[local_70].v == (NFAState **)0x0) {
            x->chars[local_70].v = x->chars[local_70].e;
            uVar1 = x->chars[local_70].n;
            x->chars[local_70].n = uVar1 + 1;
            x->chars[local_70].e[uVar1] = pNVar5;
          }
          else if (x->chars[local_70].v == x->chars[local_70].e) {
            if (x->chars[local_70].n < 3) {
              ppNVar2 = x->chars[local_70].v;
              uVar1 = x->chars[local_70].n;
              x->chars[local_70].n = uVar1 + 1;
              ppNVar2[uVar1] = pNVar5;
            }
            else {
LAB_0014701c:
              vec_add_internal(x->chars + local_70,pNVar5);
            }
          }
          else {
            if ((x->chars[local_70].n & 7) == 0) goto LAB_0014701c;
            ppNVar2 = x->chars[local_70].v;
            uVar1 = x->chars[local_70].n;
            x->chars[local_70].n = uVar1 + 1;
            ppNVar2[uVar1] = pNVar5;
          }
        }
      }
      s = x;
      x = pNVar5;
      break;
    case 0x5c:
      pNVar7 = (NFAState *)((long)&p->index + 2);
      reg._7_1_ = (byte)pNVar5->index;
      pNVar5 = pNVar7;
      if (reg._7_1_ == 0) {
        reg._7_1_ = 0;
LAB_00147f81:
        p = pNVar7;
        d_fail("bad (part of) regex: %s\n",*(undefined8 *)pp_local);
        iVar3._0_1_ = mark[0xfc];
        iVar3._1_1_ = mark[0xfd];
        iVar3._2_1_ = mark[0xfe];
        iVar3._3_1_ = mark[0xff];
        return iVar3;
      }
    default:
      p = pNVar5;
      if ((*(int *)(areg_local + 7) == 0) ||
         (ppuVar6 = __ctype_b_loc(), ((*ppuVar6)[(int)(uint)reg._7_1_] & 0x400) == 0)) {
        if (x->chars[reg._7_1_].v == (NFAState **)0x0) {
          n = new_NFAState((LexState *)areg_local);
          x->chars[reg._7_1_].v = x->chars[reg._7_1_].e;
          uVar1 = x->chars[reg._7_1_].n;
          x->chars[reg._7_1_].n = uVar1 + 1;
          x->chars[reg._7_1_].e[uVar1] = n;
        }
        else if (x->chars[reg._7_1_].v == x->chars[reg._7_1_].e) {
          if (x->chars[reg._7_1_].n < 3) {
            n = new_NFAState((LexState *)areg_local);
            ppNVar2 = x->chars[reg._7_1_].v;
            uVar1 = x->chars[reg._7_1_].n;
            x->chars[reg._7_1_].n = uVar1 + 1;
            ppNVar2[uVar1] = n;
          }
          else {
LAB_0014776b:
            uVar8 = (ulong)reg._7_1_;
            n = new_NFAState((LexState *)areg_local);
            vec_add_internal(x->chars + uVar8,n);
          }
        }
        else {
          if ((x->chars[reg._7_1_].n & 7) == 0) goto LAB_0014776b;
          n = new_NFAState((LexState *)areg_local);
          ppNVar2 = x->chars[reg._7_1_].v;
          uVar1 = x->chars[reg._7_1_].n;
          x->chars[reg._7_1_].n = uVar1 + 1;
          ppNVar2[uVar1] = n;
        }
      }
      else {
        iVar3 = tolower((uint)reg._7_1_);
        if (x->chars[iVar3].v == (NFAState **)0x0) {
          n = new_NFAState((LexState *)areg_local);
          iVar3 = tolower((uint)reg._7_1_);
          iVar4 = tolower((uint)reg._7_1_);
          x->chars[iVar4].v = x->chars[iVar3].e;
          iVar4 = tolower((uint)reg._7_1_);
          uVar1 = x->chars[iVar4].n;
          x->chars[iVar4].n = uVar1 + 1;
          x->chars[iVar3].e[uVar1] = n;
        }
        else {
          iVar3 = tolower((uint)reg._7_1_);
          ppNVar2 = x->chars[iVar3].v;
          iVar3 = tolower((uint)reg._7_1_);
          if (ppNVar2 == x->chars[iVar3].e) {
            iVar3 = tolower((uint)reg._7_1_);
            if (x->chars[iVar3].n < 3) {
              n = new_NFAState((LexState *)areg_local);
              iVar3 = tolower((uint)reg._7_1_);
              ppNVar2 = x->chars[iVar3].v;
              iVar3 = tolower((uint)reg._7_1_);
              uVar1 = x->chars[iVar3].n;
              x->chars[iVar3].n = uVar1 + 1;
              ppNVar2[uVar1] = n;
            }
            else {
LAB_00147ac7:
              iVar3 = tolower((uint)reg._7_1_);
              n = new_NFAState((LexState *)areg_local);
              vec_add_internal(x->chars + iVar3,n);
            }
          }
          else {
            iVar3 = tolower((uint)reg._7_1_);
            if ((x->chars[iVar3].n & 7) == 0) goto LAB_00147ac7;
            n = new_NFAState((LexState *)areg_local);
            iVar3 = tolower((uint)reg._7_1_);
            ppNVar2 = x->chars[iVar3].v;
            iVar3 = tolower((uint)reg._7_1_);
            uVar1 = x->chars[iVar3].n;
            x->chars[iVar3].n = uVar1 + 1;
            ppNVar2[uVar1] = n;
          }
        }
        iVar3 = toupper((uint)reg._7_1_);
        if (x->chars[iVar3].v == (NFAState **)0x0) {
          iVar3 = toupper((uint)reg._7_1_);
          iVar4 = toupper((uint)reg._7_1_);
          x->chars[iVar4].v = x->chars[iVar3].e;
          iVar4 = toupper((uint)reg._7_1_);
          uVar1 = x->chars[iVar4].n;
          x->chars[iVar4].n = uVar1 + 1;
          x->chars[iVar3].e[uVar1] = n;
        }
        else {
          iVar3 = toupper((uint)reg._7_1_);
          ppNVar2 = x->chars[iVar3].v;
          iVar3 = toupper((uint)reg._7_1_);
          if (ppNVar2 == x->chars[iVar3].e) {
            iVar3 = toupper((uint)reg._7_1_);
            if (x->chars[iVar3].n < 3) {
              iVar3 = toupper((uint)reg._7_1_);
              ppNVar2 = x->chars[iVar3].v;
              iVar3 = toupper((uint)reg._7_1_);
              uVar1 = x->chars[iVar3].n;
              x->chars[iVar3].n = uVar1 + 1;
              ppNVar2[uVar1] = n;
            }
            else {
LAB_00147e1d:
              iVar3 = toupper((uint)reg._7_1_);
              vec_add_internal(x->chars + iVar3,n);
            }
          }
          else {
            iVar3 = toupper((uint)reg._7_1_);
            if ((x->chars[iVar3].n & 7) == 0) goto LAB_00147e1d;
            iVar3 = toupper((uint)reg._7_1_);
            ppNVar2 = x->chars[iVar3].v;
            iVar3 = toupper((uint)reg._7_1_);
            uVar1 = x->chars[iVar3].n;
            x->chars[iVar3].n = uVar1 + 1;
            ppNVar2[uVar1] = n;
          }
        }
      }
      s = x;
      x = n;
      break;
    case 0x7c:
      if ((x->epsilon).v == (NFAState **)0x0) {
        (x->epsilon).v = (x->epsilon).e;
        uVar1 = (x->epsilon).n;
        (x->epsilon).n = uVar1 + 1;
        (x->epsilon).e[uVar1] = (NFAState *)trailing_local;
        p = pNVar5;
      }
      else if ((x->epsilon).v == (x->epsilon).e) {
        if ((x->epsilon).n < 3) {
          uVar1 = (x->epsilon).n;
          (x->epsilon).n = uVar1 + 1;
          (x->epsilon).v[uVar1] = (NFAState *)trailing_local;
          p = pNVar5;
        }
        else {
LAB_00146bdb:
          p = pNVar5;
          vec_add_internal(&x->epsilon,trailing_local);
        }
      }
      else {
        if (((x->epsilon).n & 7) == 0) goto LAB_00146bdb;
        uVar1 = (x->epsilon).n;
        (x->epsilon).n = uVar1 + 1;
        (x->epsilon).v[uVar1] = (NFAState *)trailing_local;
        p = pNVar5;
      }
      if ((nn_local->epsilon).v == (NFAState **)0x0) {
        x = new_NFAState((LexState *)areg_local);
        (nn_local->epsilon).v = (nn_local->epsilon).e;
        uVar1 = (nn_local->epsilon).n;
        (nn_local->epsilon).n = uVar1 + 1;
        (nn_local->epsilon).e[uVar1] = x;
      }
      else if ((nn_local->epsilon).v == (nn_local->epsilon).e) {
        if ((nn_local->epsilon).n < 3) {
          x = new_NFAState((LexState *)areg_local);
          uVar1 = (nn_local->epsilon).n;
          (nn_local->epsilon).n = uVar1 + 1;
          (nn_local->epsilon).v[uVar1] = x;
        }
        else {
LAB_00146d04:
          v = &nn_local->epsilon;
          x = new_NFAState((LexState *)areg_local);
          vec_add_internal(v,x);
        }
      }
      else {
        if (((nn_local->epsilon).n & 7) == 0) goto LAB_00146d04;
        x = new_NFAState((LexState *)areg_local);
        uVar1 = (nn_local->epsilon).n;
        (nn_local->epsilon).n = uVar1 + 1;
        (nn_local->epsilon).v[uVar1] = x;
      }
    }
    goto LAB_00146a19;
  }
LAB_00147e6b:
  if ((x->epsilon).v == (NFAState **)0x0) {
    (x->epsilon).v = (x->epsilon).e;
    uVar1 = (x->epsilon).n;
    (x->epsilon).n = uVar1 + 1;
    (x->epsilon).e[uVar1] = nn;
    p = pNVar5;
  }
  else {
    if ((x->epsilon).v == (x->epsilon).e) {
      if ((x->epsilon).n < 3) {
        uVar1 = (x->epsilon).n;
        (x->epsilon).n = uVar1 + 1;
        (x->epsilon).v[uVar1] = nn;
        p = pNVar5;
        goto LAB_00147f6e;
      }
    }
    else if (((x->epsilon).n & 7) != 0) {
      uVar1 = (x->epsilon).n;
      (x->epsilon).n = uVar1 + 1;
      (x->epsilon).v[uVar1] = nn;
      p = pNVar5;
      goto LAB_00147f6e;
    }
    p = pNVar5;
    vec_add_internal(&x->epsilon,nn);
  }
LAB_00147f6e:
  *(NFAState **)pp_local = p;
  iVar4._0_1_ = mark[0xfc];
  iVar4._1_1_ = mark[0xfd];
  iVar4._2_1_ = mark[0xfe];
  iVar4._3_1_ = mark[0xff];
  return iVar4;
}

Assistant:

static int build_regex_nfa(LexState *ls, uint8 **areg, NFAState *pp, NFAState *nn, Action *trailing) {
  uint8 c, pc, *reg = *areg;
  NFAState *p = pp, *s, *x, *n = nn;
  int reversed, i, has_trailing = 0;
  uint8 mark[256];

  s = p;
  while ((c = *reg++)) {
    switch (c) {
      case '(':
        has_trailing = build_regex_nfa(ls, &reg, s, (x = new_NFAState(ls)), trailing) || has_trailing;
        p = s;
        s = x;
        break;
      case ')':
        goto Lreturn;
      case '|':
        vec_add(&s->epsilon, nn);
        vec_add(&pp->epsilon, (s = new_NFAState(ls)));
        break;
      case '[':
        if (*reg == '^') {
          reg++;
          reversed = 1;
        } else
          reversed = 0;
        memset(mark, 0, sizeof(mark));
        pc = UCHAR_MAX;
        while ((c = *reg++)) {
          switch (c) {
            case ']':
              goto Lsetdone;
            case '-':
              c = *reg++;
              if (!c) goto Lerror;
              if (c == '\\') c = *reg++;
              if (!c) goto Lerror;
              for (; pc <= c; pc++) mark[pc] = 1;
              break;
            case '\\':
              c = *reg++;
              /* fall through */
            default:
              pc = c;
              mark[c] = 1;
              break;
          }
        }
      Lsetdone:
        x = new_NFAState(ls);
        for (i = 1; i < 256; i++)
          if ((!reversed && mark[i]) || (reversed && !mark[i])) vec_add(&s->chars[i], x);
        p = s;
        s = x;
        break;
      case '?':
        vec_add(&p->epsilon, s);
        break;
      case '*':
        vec_add(&p->epsilon, s);
        vec_add(&s->epsilon, p);
        break;
      case '+':
        vec_add(&s->epsilon, p);
        break;
      case '/':
        vec_add(&s->accepts, trailing);
        has_trailing = 1;
        break;
      case '\\':
        c = *reg++;
        if (!c) goto Lerror;
        /* fall through */
      default:
        if (!ls->ignore_case || !isalpha(c))
          vec_add(&s->chars[c], (x = new_NFAState(ls)));
        else {
          vec_add(&s->chars[tolower(c)], (x = new_NFAState(ls)));
          vec_add(&s->chars[toupper(c)], x);
        }
        p = s;
        s = x;
        break;
    }
  }
Lreturn:
  vec_add(&s->epsilon, n);
  *areg = reg;
  return has_trailing;
Lerror:
  d_fail("bad (part of) regex: %s\n", *areg);
  return has_trailing;
}